

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_sequential_encoder.cc
# Opt level: O2

Status * __thiscall
draco::PointCloudSequentialEncoder::EncodeGeometryData
          (Status *__return_storage_ptr__,PointCloudSequentialEncoder *this)

{
  int32_t num_points;
  ValueType local_c;
  
  local_c = ((this->super_PointCloudEncoder).point_cloud_)->num_points_;
  EncoderBuffer::Encode<int>((this->super_PointCloudEncoder).buffer_,(int *)&local_c);
  __return_storage_ptr__->code_ = OK;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_string_length = 0;
  (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudSequentialEncoder::EncodeGeometryData() {
  const int32_t num_points = point_cloud()->num_points();
  buffer()->Encode(num_points);
  return OkStatus();
}